

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O3

void brotli::SplitBlock(Command *cmds,size_t num_commands,uint8_t *data,size_t pos,size_t mask,
                       BlockSplit *literal_split,BlockSplit *insert_and_copy_split,
                       BlockSplit *dist_split)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> literals;
  vector<unsigned_short,_std::allocator<unsigned_short>_> insert_and_copy_codes;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_38;
  
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CopyLiteralsToByteArray(cmds,num_commands,data,pos,mask,&local_58);
  local_38.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CopyCommandsToByteArray(cmds,num_commands,&local_38,&local_78);
  SplitByteVector<brotli::Histogram<256>,unsigned_char>(&local_58,0x220,100,0x46,28.1,literal_split)
  ;
  SplitByteVector<brotli::Histogram<704>,unsigned_short>
            (&local_38,0x212,0x32,0x28,13.5,insert_and_copy_split);
  SplitByteVector<brotli::Histogram<520>,unsigned_short>(&local_78,0x220,0x32,0x28,14.6,dist_split);
  if (local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SplitBlock(const Command* cmds,
                const size_t num_commands,
                const uint8_t* data,
                const size_t pos,
                const size_t mask,
                BlockSplit* literal_split,
                BlockSplit* insert_and_copy_split,
                BlockSplit* dist_split) {
  // Create a continuous array of literals.
  std::vector<uint8_t> literals;
  CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, &literals);

  // Compute prefix codes for commands.
  std::vector<uint16_t> insert_and_copy_codes;
  std::vector<uint16_t> distance_prefixes;
  CopyCommandsToByteArray(cmds, num_commands,
                          &insert_and_copy_codes,
                          &distance_prefixes);

  SplitByteVector<HistogramLiteral>(
      literals,
      kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
      kLiteralStrideLength, kLiteralBlockSwitchCost,
      literal_split);
  SplitByteVector<HistogramCommand>(
      insert_and_copy_codes,
      kSymbolsPerCommandHistogram, kMaxCommandHistograms,
      kCommandStrideLength, kCommandBlockSwitchCost,
      insert_and_copy_split);
  SplitByteVector<HistogramDistance>(
      distance_prefixes,
      kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
      kCommandStrideLength, kDistanceBlockSwitchCost,
      dist_split);
}